

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void make_niches(level *lev)

{
  schar sVar1;
  int iVar2;
  bool local_1c;
  bool local_1b;
  boolean vamp;
  int iStack_14;
  boolean ltptr;
  int dep;
  int ct;
  level *lev_local;
  
  iStack_14 = rnd((lev->nroom >> 1) + 1);
  sVar1 = depth(&lev->z);
  local_1b = (*(uint *)&(lev->flags).field_0x8 >> 0xb & 1) == 0 && '\x0f' < sVar1;
  local_1c = '\x05' < sVar1 && sVar1 < '\x19';
  while (iVar2 = iStack_14 + -1, iStack_14 != 0) {
    iStack_14 = iVar2;
    if ((local_1b) && (iVar2 = rn2(6), iVar2 == 0)) {
      local_1b = false;
      makeniche(lev,0x11);
    }
    else if ((local_1c) && (iVar2 = rn2(6), iVar2 == 0)) {
      local_1c = false;
      makeniche(lev,0xe);
    }
    else {
      makeniche(lev,0);
    }
  }
  return;
}

Assistant:

static void make_niches(struct level *lev)
{
	int ct = rnd((lev->nroom>>1) + 1), dep = depth(&lev->z);

	boolean	ltptr = (!lev->flags.noteleport && dep > 15),
		vamp = (dep > 5 && dep < 25);

	while (ct--) {
		if (ltptr && !rn2(6)) {
			ltptr = FALSE;
			makeniche(lev, LEVEL_TELEP);
		} else if (vamp && !rn2(6)) {
			vamp = FALSE;
			makeniche(lev, TRAPDOOR);
		} else	makeniche(lev, NO_TRAP);
	}
}